

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O2

thread_ret_t ggml_graph_compute_secondary_thread(void *data)

{
  uint uVar1;
  pthread_mutex_t *__mutex;
  pthread_mutex_t *__mutex_00;
  _Bool _Var2;
  uint64_t i;
  ulong uVar3;
  ggml_threadpool *threadpool;
  
  __mutex = *(pthread_mutex_t **)((long)data + 0x210);
  ggml_thread_apply_priority(*(int32_t *)((long)__mutex + 0x120));
  _Var2 = ggml_thread_cpumask_is_valid((_Bool *)((long)data + 8));
  if (_Var2) {
    ggml_thread_apply_affinity((_Bool *)((long)data + 8));
  }
  while( true ) {
    while ((*(byte *)((long)__mutex + 0x105) & 1) != 0) {
      pthread_mutex_lock(__mutex);
      if ((*(byte *)((long)__mutex + 0x105) & 1) != 0) {
        pthread_cond_wait((pthread_cond_t *)(__mutex + 1),__mutex);
      }
      pthread_mutex_unlock(__mutex);
    }
    if ((*(byte *)((long)__mutex + 0x104) & 1) != 0) break;
    __mutex_00 = *(pthread_mutex_t **)((long)data + 0x210);
    if (*(int *)((long)data + 0x218) < *(int *)((long)__mutex_00 + 0x11c)) {
      uVar1 = *(uint *)((long)__mutex_00 + 0x124);
      for (uVar3 = 0;
          (_Var2 = ggml_graph_compute_thread_ready((ggml_compute_state *)data), !_Var2 &&
          (uVar3 < (ulong)uVar1 << 0x11)); uVar3 = uVar3 + 1) {
      }
    }
    if (*(char *)((long)data + 0x20c) != '\x01') {
      pthread_mutex_lock(__mutex_00);
      while (_Var2 = ggml_graph_compute_thread_ready((ggml_compute_state *)data), !_Var2) {
        pthread_cond_wait((pthread_cond_t *)(__mutex_00 + 1),__mutex_00);
      }
      pthread_mutex_unlock(__mutex_00);
    }
    if (*(char *)((long)data + 0x20c) == '\x01') {
      *(undefined1 *)((long)data + 0x20c) = 0;
      ggml_graph_compute_thread(data);
    }
  }
  return (thread_ret_t)0x0;
}

Assistant:

static thread_ret_t ggml_graph_compute_secondary_thread(void* data) {
    struct ggml_compute_state * state = (struct ggml_compute_state *) data;
    struct ggml_threadpool * threadpool = state->threadpool;

    ggml_thread_apply_priority(threadpool->prio);
    if (ggml_thread_cpumask_is_valid(state->cpumask)) {
        ggml_thread_apply_affinity(state->cpumask);
    }

    while (true) {
        // Check if we need to sleep
        while (threadpool->pause) {
            GGML_PRINT_DEBUG("thread #%d inside pause loop\n", state->ith);
            ggml_mutex_lock_shared(&threadpool->mutex);
            if (threadpool->pause) {
                ggml_cond_wait(&threadpool->cond, &threadpool->mutex);
            }
            GGML_PRINT_DEBUG("thread #%d resuming after wait\n", state->ith);
            ggml_mutex_unlock_shared(&threadpool->mutex);
        }

        // This needs to be checked for after the cond_wait
        if (threadpool->stop) break;

        // Check if there is new work
        // The main thread is the only one that can dispatch new work

        ggml_graph_compute_check_for_work(state);
        if (state->pending) {
            state->pending = false;

            ggml_graph_compute_thread(state);
        }
    }

    return (thread_ret_t) 0;
}